

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Integer MA_sizeof(Integer datatype1,Integer nelem1,Integer datatype2)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  ma_stats.calls[0x1c] = ma_stats.calls[0x1c] + 1;
  ma_preinitialize("MA_sizeof");
  if (datatype1 - 1000U < 0x11) {
    if (-1 < nelem1) {
      if (datatype2 - 1000U < 0x11) {
        uVar2 = *(int *)(datatype1 * 4 + 0x271150) * nelem1;
        uVar3 = (ulong)*(int *)(datatype2 * 4 + 0x271150);
        return (uVar2 / uVar3 + 1) - (ulong)(uVar2 % uVar3 == 0);
      }
      sprintf(ma_ebuf,"invalid datatype: %ld",datatype2);
      goto LAB_001f08ce;
    }
    pcVar1 = "block \'%s\', invalid nelem: %ld";
  }
  else {
    pcVar1 = "block \'%s\', invalid datatype: %ld";
    nelem1 = datatype1;
  }
  sprintf(ma_ebuf,pcVar1 + 0xc,nelem1);
LAB_001f08ce:
  ma_error(EL_Fatal,ET_External,"MA_sizeof",ma_ebuf);
  return 0;
}

Assistant:

public Integer MA_sizeof(
    Integer    datatype1,    /* of source elements */
    Integer    nelem1,        /* # of source elements */
    Integer    datatype2     /* of target elements */)
{
    ulongi    source_bytes;    /* nelem1 * ma_sizeof[datatype1] */
    int        ceiling;    /* 1 iff ceiling alters result */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_sizeof]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return DONTCARE;
#endif /* VERIFY */

    /* preinitialize if necessary */
    ma_preinitialize("MA_sizeof");

    /* verify datatype1 */
    if (!mt_valid(datatype1))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype1);
        ma_error(EL_Fatal, ET_External, "MA_sizeof", ma_ebuf);
        return DONTCARE;
    }

    /* verify nelem1 */
    if (nelem1 < 0)
    {
        (void)sprintf(ma_ebuf,
            "invalid nelem: %ld",
            (size_t)nelem1);
        ma_error(EL_Fatal, ET_External, "MA_sizeof", ma_ebuf);
        return DONTCARE;
    }

    /* verify datatype2 */
    if (!mt_valid(datatype2))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype2);
        ma_error(EL_Fatal, ET_External, "MA_sizeof", ma_ebuf);
        return DONTCARE;
    }

    /* convert datatype1 to internal (index-suitable) value */
    datatype1 = mt_import(datatype1);

    /* convert datatype2 to internal (index-suitable) value */
    datatype2 = mt_import(datatype2);

    /* compute and return the result */
    source_bytes = nelem1 * ma_sizeof[datatype1];
    ceiling = (source_bytes % ma_sizeof[datatype2]) ? 1 : 0;
    return (Integer)((source_bytes / ma_sizeof[datatype2]) + ceiling);
}